

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall
pbrt::StatsAccumulator::AccumulatePixelStats(StatsAccumulator *this,PixelStatsAccumulator *accum)

{
  Image *pIVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  pointer pbVar3;
  pointer pIVar4;
  Allocator AVar5;
  long lVar6;
  int iVar7;
  Point2i PVar8;
  Stats *pSVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  Image *pIVar13;
  long lVar14;
  long *plVar15;
  Float FVar16;
  Float FVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  Point2i vb;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  long *local_180 [2];
  long local_170 [2];
  ColorEncodingHandle local_160;
  ColorEncodingHandle local_158;
  Point2i va;
  int local_148;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_a0;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_98;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_78;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_58;
  ColorEncodingHandle local_38;
  
  iVar10 = imageBounds._8_4_ - imageBounds._0_4_;
  iVar7 = imageBounds._12_4_ - imageBounds._4_4_;
  TVar2 = (this->stats->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>;
  if (TVar2 == (Tuple2<pbrt::Point2,_int>)0x0) {
    vb.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)&local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"ms","");
    PVar8.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
    PVar8.super_Tuple2<pbrt::Point2,_int>.x = iVar10;
    local_38.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    AVar5.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 1;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
    Image::Image((Image *)&va,Float,PVar8,channels,&local_38,AVar5);
    pSVar9 = this->stats;
    (pSVar9->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.y = local_148;
    (pSVar9->pixelTime).format = va.super_Tuple2<pbrt::Point2,_int>.x;
    (pSVar9->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.x =
         va.super_Tuple2<pbrt::Point2,_int>.y;
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(pSVar9->pixelTime).channelNames,&local_140);
    (pSVar9->pixelTime).encoding.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = local_a0.bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&(pSVar9->pixelTime).p8,&local_98);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&(pSVar9->pixelTime).p16,&local_78);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&(pSVar9->pixelTime).p32,&local_58);
    local_58.nStored = 0;
    (*(local_58.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_58.alloc.memoryResource,local_58.ptr,local_58.nAlloc << 2,4);
    local_78.nStored = 0;
    (*(local_78.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_78.alloc.memoryResource,local_78.ptr,local_78.nAlloc * 2,2);
    local_98.nStored = 0;
    (*(local_98.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_98.alloc.memoryResource,local_98.ptr,local_98.nAlloc,1);
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_140);
    if (vb.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)&local_1b0) {
      operator_delete((void *)vb.super_Tuple2<pbrt::Point2,_int>,local_1b0._M_allocated_capacity + 1
                     );
    }
  }
  else {
    vb.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
    vb.super_Tuple2<pbrt::Point2,_int>.x = iVar10;
    auVar18._8_8_ = 0;
    auVar18._0_4_ = TVar2.x;
    auVar18._4_4_ = TVar2.y;
    auVar20._8_8_ = 0;
    auVar20._0_4_ = iVar10;
    auVar20._4_4_ = iVar7;
    uVar12 = vpcmpd_avx512vl(auVar18,auVar20,4);
    if ((uVar12 & 3) != 0) {
      va.super_Tuple2<pbrt::Point2,_int> = TVar2;
      LogFatal<char_const(&)[30],char_const(&)[4],char_const(&)[30],pbrt::Point2<int>&,char_const(&)[4],pbrt::Point2<int>&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
                 ,0x105,"Check failed: %s == %s with %s = %s, %s = %s",
                 (char (*) [30])"stats->pixelTime.Resolution()",(char (*) [4])0x5d30f6,
                 (char (*) [30])"stats->pixelTime.Resolution()",&va,(char (*) [4])0x5d30f6,&vb);
    }
  }
  va.super_Tuple2<pbrt::Point2,_int> =
       (this->stats->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>;
  vb.super_Tuple2<pbrt::Point2,_int> =
       (accum->stats->time).resolution.super_Tuple2<pbrt::Point2,_int>;
  auVar19._8_8_ = 0;
  auVar19._0_4_ = va.super_Tuple2<pbrt::Point2,_int>.x;
  auVar19._4_4_ = va.super_Tuple2<pbrt::Point2,_int>.y;
  auVar21._8_8_ = 0;
  auVar21._0_4_ = vb.super_Tuple2<pbrt::Point2,_int>.x;
  auVar21._4_4_ = vb.super_Tuple2<pbrt::Point2,_int>.y;
  uVar12 = vpcmpd_avx512vl(auVar19,auVar21,4);
  if ((uVar12 & 3) != 0) {
    LogFatal<char_const(&)[30],char_const(&)[31],char_const(&)[30],pbrt::Point2<int>&,char_const(&)[31],pbrt::Point2<int>&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
               ,0x106,"Check failed: %s == %s with %s = %s, %s = %s",
               (char (*) [30])"stats->pixelTime.Resolution()",
               (char (*) [31])"accum.stats->time.Resolution()",
               (char (*) [30])"stats->pixelTime.Resolution()",&va,
               (char (*) [31])"accum.stats->time.Resolution()",&vb);
  }
  pSVar9 = this->stats;
  if (0 < (pSVar9->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.y) {
    lVar14 = 0;
    lVar6 = 0;
    do {
      pSVar9 = this->stats;
      if (0 < (pSVar9->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.x) {
        lVar11 = 0;
        do {
          PVar8.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar14 + lVar11);
          FVar16 = Image::GetChannel(&pSVar9->pixelTime,PVar8,0,(WrapMode2D)0x200000002);
          FVar17 = Image::GetChannel(&accum->stats->time,PVar8,0,(WrapMode2D)0x200000002);
          Image::SetChannel(&pSVar9->pixelTime,PVar8,0,FVar17 + FVar16);
          lVar11 = lVar11 + 1;
          pSVar9 = this->stats;
        } while (lVar11 < (pSVar9->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.x);
      }
      lVar6 = lVar6 + 1;
      pSVar9 = this->stats;
      lVar14 = lVar14 + 0x100000000;
    } while (lVar6 < (pSVar9->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.y);
  }
  uVar12 = (long)(accum->stats->counterImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(accum->stats->counterImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if ((ulong)((long)(pSVar9->pixelCounterImages).
                    super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(pSVar9->pixelCounterImages).
                   super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                   super__Vector_impl_data._M_start) < uVar12) {
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
              (&pSVar9->pixelCounterImages,((long)uVar12 >> 3) * -0x5075075075075075);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->stats->pixelCounterNames,
             (long)(accum->stats->counterNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(accum->stats->counterNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  }
  pSVar9 = this->stats;
  uVar12 = (long)(accum->stats->ratioImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(accum->stats->ratioImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if ((ulong)((long)(pSVar9->pixelRatioImages).
                    super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(pSVar9->pixelRatioImages).
                   super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                   super__Vector_impl_data._M_start) < uVar12) {
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
              (&pSVar9->pixelRatioImages,((long)uVar12 >> 3) * -0x5075075075075075);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->stats->pixelRatioNames,
             (long)(accum->stats->ratioNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(accum->stats->ratioNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  }
  if ((accum->stats->counterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (accum->stats->counterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      pbVar3 = (this->stats->pixelCounterNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar3[uVar12]._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)(pbVar3 + uVar12));
      }
      pIVar4 = (accum->stats->counterImages).
               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pIVar4[uVar12].resolution.super_Tuple2<pbrt::Point2,_int> !=
          (Tuple2<pbrt::Point2,_int>)0x0) {
        pIVar13 = pIVar4 + uVar12;
        pIVar4 = (this->stats->pixelCounterImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pIVar1 = pIVar4 + uVar12;
        if (pIVar4[uVar12].resolution.super_Tuple2<pbrt::Point2,_int> ==
            (Tuple2<pbrt::Point2,_int>)0x0) {
          TVar2 = (pIVar13->resolution).super_Tuple2<pbrt::Point2,_int>;
          vb.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)&local_1b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"count","");
          local_158.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          AVar5.memoryResource = pstd::pmr::new_delete_resource();
          channels_00.n = 1;
          channels_00.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb
          ;
          Image::Image((Image *)&va,Float,(Point2i)TVar2,channels_00,&local_158,AVar5);
          (pIVar1->resolution).super_Tuple2<pbrt::Point2,_int>.y = local_148;
          pIVar1->format = va.super_Tuple2<pbrt::Point2,_int>.x;
          (pIVar1->resolution).super_Tuple2<pbrt::Point2,_int>.x =
               va.super_Tuple2<pbrt::Point2,_int>.y;
          InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&pIVar1->channelNames,&local_140);
          (pIVar1->encoding).
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = local_a0.bits;
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                    (&pIVar1->p8,&local_98);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                    (&pIVar1->p16,&local_78);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    (&pIVar1->p32,&local_58);
          local_58.nStored = 0;
          (*(local_58.alloc.memoryResource)->_vptr_memory_resource[3])
                    (local_58.alloc.memoryResource,local_58.ptr,local_58.nAlloc << 2,4);
          local_78.nStored = 0;
          (*(local_78.alloc.memoryResource)->_vptr_memory_resource[3])
                    (local_78.alloc.memoryResource,local_78.ptr,local_78.nAlloc * 2,2);
          local_98.nStored = 0;
          (*(local_98.alloc.memoryResource)->_vptr_memory_resource[3])
                    (local_98.alloc.memoryResource,local_98.ptr,local_98.nAlloc,1);
          InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~InlinedVector(&local_140);
          if (vb.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)&local_1b0) {
            operator_delete((void *)vb.super_Tuple2<pbrt::Point2,_int>,
                            local_1b0._M_allocated_capacity + 1);
          }
        }
        if (0 < (pIVar13->resolution).super_Tuple2<pbrt::Point2,_int>.y) {
          lVar14 = 0;
          lVar6 = 0;
          do {
            if (0 < (pIVar13->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
              lVar11 = 0;
              do {
                PVar8.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar14 + lVar11)
                ;
                FVar16 = Image::GetChannel(pIVar1,PVar8,0,(WrapMode2D)0x200000002);
                FVar17 = Image::GetChannel(pIVar13,PVar8,0,(WrapMode2D)0x200000002);
                Image::SetChannel(pIVar1,PVar8,0,FVar17 + FVar16);
                lVar11 = lVar11 + 1;
              } while (lVar11 < (pIVar13->resolution).super_Tuple2<pbrt::Point2,_int>.x);
            }
            lVar6 = lVar6 + 1;
            lVar14 = lVar14 + 0x100000000;
          } while (lVar6 < (pIVar13->resolution).super_Tuple2<pbrt::Point2,_int>.y);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)(((long)(accum->stats->counterImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(accum->stats->counterImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5075075075075075));
  }
  if ((accum->stats->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (accum->stats->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      pbVar3 = (this->stats->pixelRatioNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar3[uVar12]._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)(pbVar3 + uVar12));
      }
      pIVar4 = (accum->stats->ratioImages).
               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pIVar4[uVar12].resolution.super_Tuple2<pbrt::Point2,_int> !=
          (Tuple2<pbrt::Point2,_int>)0x0) {
        pIVar13 = pIVar4 + uVar12;
        pIVar4 = (this->stats->pixelRatioImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pIVar1 = pIVar4 + uVar12;
        if (pIVar4[uVar12].resolution.super_Tuple2<pbrt::Point2,_int> ==
            (Tuple2<pbrt::Point2,_int>)0x0) {
          TVar2 = (pIVar13->resolution).super_Tuple2<pbrt::Point2,_int>;
          vb.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)&local_1b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"numerator","");
          local_1a0[0] = local_190;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"denominator","");
          local_180[0] = local_170;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"ratio","");
          local_160.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          AVar5.memoryResource = pstd::pmr::new_delete_resource();
          channels_01.n = 3;
          channels_01.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb
          ;
          Image::Image((Image *)&va,Float,(Point2i)TVar2,channels_01,&local_160,AVar5);
          (pIVar1->resolution).super_Tuple2<pbrt::Point2,_int>.y = local_148;
          pIVar1->format = va.super_Tuple2<pbrt::Point2,_int>.x;
          (pIVar1->resolution).super_Tuple2<pbrt::Point2,_int>.x =
               va.super_Tuple2<pbrt::Point2,_int>.y;
          InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&pIVar1->channelNames,&local_140);
          (pIVar1->encoding).
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = local_a0.bits;
          pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                    (&pIVar1->p8,&local_98);
          pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                    (&pIVar1->p16,&local_78);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    (&pIVar1->p32,&local_58);
          local_58.nStored = 0;
          (*(local_58.alloc.memoryResource)->_vptr_memory_resource[3])
                    (local_58.alloc.memoryResource,local_58.ptr,local_58.nAlloc << 2,4);
          local_78.nStored = 0;
          (*(local_78.alloc.memoryResource)->_vptr_memory_resource[3])
                    (local_78.alloc.memoryResource,local_78.ptr,local_78.nAlloc * 2,2);
          local_98.nStored = 0;
          (*(local_98.alloc.memoryResource)->_vptr_memory_resource[3])
                    (local_98.alloc.memoryResource,local_98.ptr,local_98.nAlloc,1);
          InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~InlinedVector(&local_140);
          lVar6 = -0x60;
          plVar15 = local_170;
          do {
            if (plVar15 != (long *)plVar15[-2]) {
              operator_delete((long *)plVar15[-2],*plVar15 + 1);
            }
            plVar15 = plVar15 + -4;
            lVar6 = lVar6 + 0x20;
          } while (lVar6 != 0);
        }
        if (0 < (pIVar13->resolution).super_Tuple2<pbrt::Point2,_int>.y) {
          lVar14 = 0;
          lVar6 = 0;
          do {
            if (0 < (pIVar13->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
              lVar11 = 0;
              do {
                PVar8.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar14 + lVar11)
                ;
                FVar16 = Image::GetChannel(pIVar1,PVar8,0,(WrapMode2D)0x200000002);
                FVar17 = Image::GetChannel(pIVar13,PVar8,0,(WrapMode2D)0x200000002);
                Image::SetChannel(pIVar1,PVar8,0,FVar17 + FVar16);
                FVar16 = Image::GetChannel(pIVar1,PVar8,1,(WrapMode2D)0x200000002);
                FVar17 = Image::GetChannel(pIVar13,PVar8,1,(WrapMode2D)0x200000002);
                Image::SetChannel(pIVar1,PVar8,1,FVar17 + FVar16);
                FVar16 = Image::GetChannel(pIVar1,PVar8,0,(WrapMode2D)0x200000002);
                FVar17 = 0.0;
                if ((FVar16 != 0.0) || (NAN(FVar16))) {
                  FVar17 = Image::GetChannel(pIVar1,PVar8,0,(WrapMode2D)0x200000002);
                  FVar16 = Image::GetChannel(pIVar1,PVar8,1,(WrapMode2D)0x200000002);
                  FVar17 = FVar17 / FVar16;
                }
                Image::SetChannel(pIVar1,PVar8,2,FVar17);
                lVar11 = lVar11 + 1;
              } while (lVar11 < (pIVar13->resolution).super_Tuple2<pbrt::Point2,_int>.x);
            }
            lVar6 = lVar6 + 1;
            lVar14 = lVar14 + 0x100000000;
          } while (lVar6 < (pIVar13->resolution).super_Tuple2<pbrt::Point2,_int>.y);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)(((long)(accum->stats->ratioImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(accum->stats->ratioImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5075075075075075));
  }
  return;
}

Assistant:

void StatsAccumulator::AccumulatePixelStats(const PixelStatsAccumulator &accum) {
    Point2i res = Point2i(imageBounds.Diagonal());
    if (stats->pixelTime.Resolution() == Point2i(0, 0))
        stats->pixelTime = Image(PixelFormat::Float, res, {"ms"});
    else
        CHECK_EQ(stats->pixelTime.Resolution(), res);
    CHECK_EQ(stats->pixelTime.Resolution(), accum.stats->time.Resolution());

    for (int y = 0; y < stats->pixelTime.Resolution().y; ++y)
        for (int x = 0; x < stats->pixelTime.Resolution().x; ++x)
            stats->pixelTime.SetChannel({x, y}, 0,
                                        (stats->pixelTime.GetChannel({x, y}, 0) +
                                         accum.stats->time.GetChannel({x, y}, 0)));

    if (stats->pixelCounterImages.size() < accum.stats->counterImages.size()) {
        stats->pixelCounterImages.resize(accum.stats->counterImages.size());
        stats->pixelCounterNames.resize(accum.stats->counterNames.size());
    }
    if (stats->pixelRatioImages.size() < accum.stats->ratioImages.size()) {
        stats->pixelRatioImages.resize(accum.stats->ratioImages.size());
        stats->pixelRatioNames.resize(accum.stats->ratioNames.size());
    }

    for (size_t i = 0; i < accum.stats->counterImages.size(); ++i) {
        if (stats->pixelCounterNames[i].empty())
            stats->pixelCounterNames[i] = accum.stats->counterNames[i];

        const Image &threadImage = accum.stats->counterImages[i];
        if (threadImage.Resolution() == Point2i(0, 0))
            continue;
        Image &accumImage = stats->pixelCounterImages[i];
        if (accumImage.Resolution() == Point2i(0, 0))
            accumImage = Image(PixelFormat::Float, threadImage.Resolution(), {"count"});
        for (int y = 0; y < threadImage.Resolution().y; ++y)
            for (int x = 0; x < threadImage.Resolution().x; ++x)
                accumImage.SetChannel({x, y}, 0,
                                      (accumImage.GetChannel({x, y}, 0) +
                                       threadImage.GetChannel({x, y}, 0)));
    }
    for (size_t i = 0; i < accum.stats->ratioImages.size(); ++i) {
        if (stats->pixelRatioNames[i].empty())
            stats->pixelRatioNames[i] = accum.stats->ratioNames[i];

        const Image &threadImage = accum.stats->ratioImages[i];
        if (threadImage.Resolution() == Point2i(0, 0))
            continue;
        Image &accumImage = stats->pixelRatioImages[i];
        if (accumImage.Resolution() == Point2i(0, 0))
            accumImage = Image(PixelFormat::Float, threadImage.Resolution(),
                               {"numerator", "denominator", "ratio"});
        for (int y = 0; y < threadImage.Resolution().y; ++y)
            for (int x = 0; x < threadImage.Resolution().x; ++x) {
                accumImage.SetChannel({x, y}, 0,
                                      (accumImage.GetChannel({x, y}, 0) +
                                       threadImage.GetChannel({x, y}, 0)));
                accumImage.SetChannel({x, y}, 1,
                                      (accumImage.GetChannel({x, y}, 1) +
                                       threadImage.GetChannel({x, y}, 1)));
                if (accumImage.GetChannel({x, y}, 0) == 0)
                    accumImage.SetChannel({x, y}, 2, 0.f);
                else
                    accumImage.SetChannel({x, y}, 2,
                                          (accumImage.GetChannel({x, y}, 0) /
                                           accumImage.GetChannel({x, y}, 1)));
            }
    }
}